

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::detail::Type_Conversion_Base> __thiscall
chaiscript::
make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Type_Conversion_Impl<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
          (chaiscript *this,Type_Info *arg,Type_Info *arg_1,
          function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *arg_2)

{
  Type_Info t_from;
  Type_Info t_to;
  Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  _Manager_type local_58;
  type_info *local_48;
  type_info *ptStack_40;
  undefined8 local_38;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *local_28;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *arg_local_2;
  Type_Info *arg_local_1;
  Type_Info *arg_local;
  
  local_28 = arg_2;
  arg_local_2 = (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)arg_1;
  arg_local_1 = arg;
  arg_local = (Type_Info *)this;
  this_00 = (Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
             *)operator_new(0x58);
  local_38 = *(undefined8 *)&arg_local_1->m_flags;
  local_48 = arg_local_1->m_type_info;
  ptStack_40 = arg_local_1->m_bare_type_info;
  local_58 = (arg_local_2->super__Function_base)._M_manager;
  local_68 = *(undefined8 *)&(arg_local_2->super__Function_base)._M_functor;
  uStack_60 = *(undefined8 *)((long)&(arg_local_2->super__Function_base)._M_functor + 8);
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::function
            (&local_88,local_28);
  t_from.m_bare_type_info = ptStack_40;
  t_from.m_type_info = local_48;
  t_from._16_8_ = local_38;
  t_to.m_bare_type_info = (type_info *)uStack_60;
  t_to.m_type_info = (type_info *)local_68;
  t_to._16_8_ = local_58;
  detail::
  Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
  Type_Conversion_Impl(this_00,t_from,t_to,&local_88);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::
  shared_ptr<chaiscript::detail::Type_Conversion_Base,void>
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)this,
             (Type_Conversion_Base *)this_00);
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::~function(&local_88);
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }